

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::UploadTex2DCase::iterate(UploadTex2DCase *this)

{
  RenderContext *context;
  TestLog *log;
  bool bVar1;
  int iVar2;
  GLenum err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *description;
  Texture depthStencilTex;
  Renderbuffer colorBuf;
  Framebuffer fbo;
  TextureLevel stencilOnlyLevel;
  TextureLevel readLevel;
  TextureLevel uploadLevel;
  ConstPixelBufferAccess local_130;
  ObjectWrapper local_108;
  ObjectWrapper local_f0;
  ObjectWrapper local_d8;
  TextureLevel local_c0;
  TextureLevel local_98;
  TextureLevel local_70;
  ConstPixelBufferAccess local_48;
  Functions *gl;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  pOVar3 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_d8,(Functions *)CONCAT44(extraout_var_00,iVar2),pOVar3);
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  pOVar3 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_f0,(Functions *)CONCAT44(extraout_var_01,iVar2),pOVar3);
  iVar2 = (*context->_vptr_RenderContext[3])();
  pOVar3 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper(&local_108,(Functions *)CONCAT44(extraout_var_02,iVar2),pOVar3);
  local_98.m_format = glu::mapGLInternalFormat(this->m_format);
  tcu::TextureLevel::TextureLevel(&local_70,&local_98.m_format,0x81,0x71,1);
  local_c0.m_format.order = RGBA;
  local_c0.m_format.type = UNSIGNED_INT32;
  tcu::TextureLevel::TextureLevel(&local_98,&local_c0.m_format,0x81,0x71,1);
  local_130.m_format.order = S;
  local_130.m_format.type = UNSIGNED_INT8;
  tcu::TextureLevel::TextureLevel(&local_c0,&local_130.m_format,0x81,0x71,1);
  checkDepthStencilFormatSupport((this->super_TestCase).m_context,this->m_format);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_130,&local_70);
  renderTestPatternReference((PixelBufferAccess *)&local_130);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_130,&local_c0);
  renderTestPatternReference((PixelBufferAccess *)&local_130);
  (*gl->bindTexture)(0xde1,local_108.m_object);
  (*gl->texStorage2D)(0xde1,1,this->m_format,0x81,0x71);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_130,&local_70);
  glu::texSubImage2D(context,0xde1,0,0,0,&local_130);
  err = (*gl->getError)();
  glu::checkError(err,"Uploading texture data failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                  ,0x220);
  (*gl->bindRenderbuffer)(0x8d41,local_f0.m_object);
  (*gl->renderbufferStorage)(0x8d41,0x8236,0x81,0x71);
  (*gl->bindFramebuffer)(0x8d40,local_d8.m_object);
  (*gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,local_f0.m_object);
  checkFramebufferStatus(gl);
  blitStencilToColor2D(context,local_108.m_object,0x81,0x71);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_130,&local_98);
  glu::readPixels(context,0,0,(PixelBufferAccess *)&local_130);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_130,&local_c0);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_48,&local_98);
  bVar1 = compareStencilToRed(log,&local_130,&local_48);
  description = "Image comparison failed";
  if (bVar1) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar1,description
            );
  tcu::TextureLevel::~TextureLevel(&local_c0);
  tcu::TextureLevel::~TextureLevel(&local_98);
  tcu::TextureLevel::~TextureLevel(&local_70);
  glu::ObjectWrapper::~ObjectWrapper(&local_108);
  glu::ObjectWrapper::~ObjectWrapper(&local_f0);
  glu::ObjectWrapper::~ObjectWrapper(&local_d8);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&	renderCtx			= m_context.getRenderContext();
		const glw::Functions&		gl					= renderCtx.getFunctions();
		const int					width				= 129;
		const int					height				= 113;
		glu::Framebuffer			fbo					(renderCtx);
		glu::Renderbuffer			colorBuf			(renderCtx);
		glu::Texture				depthStencilTex		(renderCtx);
		TextureLevel				uploadLevel			(glu::mapGLInternalFormat(m_format), width, height);
		TextureLevel				readLevel			(TextureFormat(TextureFormat::RGBA, TextureFormat::UNSIGNED_INT32), width, height);
		TextureLevel				stencilOnlyLevel	(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8), width, height);

		checkDepthStencilFormatSupport(m_context, m_format);

		renderTestPatternReference(uploadLevel);
		renderTestPatternReference(stencilOnlyLevel);

		gl.bindTexture(GL_TEXTURE_2D, *depthStencilTex);
		gl.texStorage2D(GL_TEXTURE_2D, 1, m_format, width, height);
		glu::texSubImage2D(renderCtx, GL_TEXTURE_2D, 0, 0, 0, uploadLevel);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading texture data failed");

		gl.bindRenderbuffer(GL_RENDERBUFFER, *colorBuf);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_R32UI, width, height);

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorBuf);
		checkFramebufferStatus(gl);

		blitStencilToColor2D(renderCtx, *depthStencilTex, width, height);
		glu::readPixels(renderCtx, 0, 0, readLevel);

		{
			const bool compareOk = compareStencilToRed(m_testCtx.getLog(), stencilOnlyLevel, readLevel);
			m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL,
									compareOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}